

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase505::run(TestCase505 *this)

{
  char **this_00;
  bool bVar1;
  char *begin;
  char *end;
  bool local_63;
  Maybe<kj::_::Tuple<>_> local_62;
  bool local_60;
  Maybe<kj::_::Tuple<>_> local_5f;
  bool local_5d;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Maybe<kj::_::Tuple<>_> local_4a;
  undefined1 local_48 [8];
  Input input;
  StringPtr text;
  EndOfInput_ parser;
  TestCase505 *this_local;
  
  text.content.size_._7_1_ = 0;
  this_00 = &input.best;
  StringPtr::StringPtr((StringPtr *)this_00,"a");
  begin = StringPtr::begin((StringPtr *)this_00);
  end = StringPtr::end((StringPtr *)this_00);
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)local_48,begin,end);
  EndOfInput_::operator()
            ((EndOfInput_ *)&local_4a,
             (IteratorInput<char,_const_char_*> *)((long)&text.content.size_ + 7));
  bVar1 = Maybe<kj::_::Tuple<>_>::operator==(&local_4a,(void *)0x0);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_4a);
  if (!bVar1) {
    local_5d = kj::_::Debug::shouldLog(ERROR);
    while (local_5d != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x1ff,ERROR,"\"failed: expected \" \"parser(input) == nullptr\"",
                 (char (*) [42])"failed: expected parser(input) == nullptr");
      local_5d = false;
    }
  }
  EndOfInput_::operator()
            ((EndOfInput_ *)&local_5f,
             (IteratorInput<char,_const_char_*> *)((long)&text.content.size_ + 7));
  bVar1 = Maybe<kj::_::Tuple<>_>::operator==(&local_5f,(void *)0x0);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_5f);
  if (!bVar1) {
    local_60 = kj::_::Debug::shouldLog(ERROR);
    while (local_60 != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x200,ERROR,"\"failed: expected \" \"parser(input) == nullptr\"",
                 (char (*) [42])"failed: expected parser(input) == nullptr");
      local_60 = false;
    }
  }
  IteratorInput<char,_const_char_*>::next((IteratorInput<char,_const_char_*> *)local_48);
  EndOfInput_::operator()
            ((EndOfInput_ *)&local_62,
             (IteratorInput<char,_const_char_*> *)((long)&text.content.size_ + 7));
  bVar1 = Maybe<kj::_::Tuple<>_>::operator==(&local_62,(void *)0x0);
  Maybe<kj::_::Tuple<>_>::~Maybe(&local_62);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_63 = kj::_::Debug::shouldLog(ERROR);
    while (local_63 != false) {
      kj::_::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x202,ERROR,"\"failed: expected \" \"!(parser(input) == nullptr)\"",
                 (char (*) [45])"failed: expected !(parser(input) == nullptr)");
      local_63 = false;
    }
  }
  IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_48);
  return;
}

Assistant:

TEST(CommonParsers, EndOfInput) {
  auto parser = endOfInput;

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    EXPECT_TRUE(parser(input) == nullptr);
    EXPECT_TRUE(parser(input) == nullptr);
    input.next();
    EXPECT_FALSE(parser(input) == nullptr);
  }
}